

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4_address.c
# Opt level: O3

LY_ERR lyplg_type_store_ipv4_address
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *UNUSED_prefix_data,uint32_t hints,
                 lysc_node *UNUSED_ctx_node,lyd_value *storage,lys_glob_unres *UNUSED_unres,
                 ly_err_item **err)

{
  anon_union_24_16_e2776397_for_lyd_value_2 *__buf;
  char **str_p;
  lysc_range *range;
  LY_ERR LVar1;
  int iVar2;
  ushort **ppuVar3;
  char *__ptr;
  size_t sVar4;
  lyd_value *str_p_00;
  char *__cp;
  char *pcVar5;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar6;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  __buf = &storage->field_2;
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  storage->realtype = type;
  if (format == LY_VALUE_LYB) {
    if (value_len < 4) {
      pcVar5 = "Invalid LYB ipv4-address value size %zu (expected at least 4).";
LAB_001bd01f:
      LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,pcVar5,value_len);
    }
    else {
      if (value_len == 4) {
        __buf->int32 = *value;
      }
      else {
        ppuVar3 = __ctype_b_loc();
        sVar4 = 4;
        do {
          if (((*ppuVar3)[*(char *)((long)value + sVar4)] & 8) == 0) {
            value_len = CONCAT44(uVar6,(int)*(char *)((long)value + sVar4));
            pcVar5 = "Invalid LYB ipv4-address zone character 0x%x.";
            goto LAB_001bd01f;
          }
          sVar4 = sVar4 + 1;
        } while (value_len != sVar4);
        __buf->int32 = *value;
        if (value_len != 4) {
          value_len = value_len - 4;
          str_p_00 = (lyd_value *)((long)&storage->field_2 + 8);
          pcVar5 = (char *)((long)value + 4);
          goto LAB_001bd15f;
        }
      }
      *(undefined8 *)((long)&storage->field_2 + 8) = 0;
      LVar1 = LY_SUCCESS;
    }
  }
  else {
    LVar1 = lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
    if (LVar1 == LY_SUCCESS) {
      if ((options & 8) == 0) {
        range = (lysc_range *)type[1].name;
        if (range != (lysc_range *)0x0) {
          sVar4 = ly_utf8len((char *)value,value_len);
          LVar1 = lyplg_type_validate_range(LY_TYPE_STRING,range,sVar4,(char *)value,value_len,err);
          if (LVar1 != LY_SUCCESS) goto LAB_001bd03a;
        }
        LVar1 = lyplg_type_validate_patterns
                          ((lysc_pattern **)type[1].exts,(char *)value,value_len,err);
        if (LVar1 != LY_SUCCESS) goto LAB_001bd03a;
      }
      str_p = (char **)((long)&storage->field_2 + 8);
      pcVar5 = ly_strnchr((char *)value,0x25,value_len);
      if (pcVar5 == (char *)0x0) {
        *str_p = (char *)0x0;
        sVar4 = value_len;
        if ((options & 1) == 0) goto LAB_001bd095;
LAB_001bd0aa:
        __ptr = (char *)0x0;
        __cp = (char *)value;
      }
      else {
        sVar4 = (long)pcVar5 - (long)value;
        LVar1 = lydict_insert(ctx,pcVar5 + 1,~sVar4 + value_len,str_p);
        if (LVar1 != LY_SUCCESS) goto LAB_001bd03a;
        if ((options & 1) != 0) {
          *pcVar5 = '\0';
          goto LAB_001bd0aa;
        }
LAB_001bd095:
        __ptr = strndup((char *)value,sVar4);
        __cp = __ptr;
      }
      iVar2 = inet_pton(2,__cp,__buf);
      if (iVar2 == 0) {
        LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                           "Failed to convert IPv4 address \"%s\".",__cp);
        free(__ptr);
        if (LVar1 != LY_SUCCESS) goto LAB_001bd03a;
      }
      else {
        if ((options & 1) != 0 && pcVar5 != (char *)0x0) {
          *pcVar5 = '%';
        }
        free(__ptr);
      }
      if ((options & 1) != 0) {
        LVar1 = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
        goto LAB_001bd049;
      }
      str_p_00 = storage;
      pcVar5 = "";
      if (value_len != 0) {
        pcVar5 = (char *)value;
      }
LAB_001bd15f:
      LVar1 = lydict_insert(ctx,pcVar5,value_len,&str_p_00->_canonical);
    }
  }
LAB_001bd03a:
  if ((options & 1) != 0) {
    free(value);
  }
LAB_001bd049:
  if (LVar1 != LY_SUCCESS) {
    lydict_remove(ctx,storage->_canonical);
    storage->_canonical = (char *)0x0;
    lydict_remove(ctx,*(char **)((long)&storage->field_2 + 8));
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyplg_type_store_ipv4_address(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *UNUSED(prefix_data), uint32_t hints,
        const struct lysc_node *UNUSED(ctx_node), struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres),
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    const char *value_str = value;
    struct lysc_type_str *type_str = (struct lysc_type_str *)type;
    struct lyd_value_ipv4_address *val;
    size_t i;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    if (format == LY_VALUE_LYB) {
        /* validation */
        if (value_len < 4) {
            ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB ipv4-address value size %zu "
                    "(expected at least 4).", value_len);
            goto cleanup;
        }
        for (i = 4; i < value_len; ++i) {
            if (!isalnum(value_str[i])) {
                ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB ipv4-address zone character 0x%x.",
                        value_str[i]);
                goto cleanup;
            }
        }

        /* store IP address */
        memcpy(&val->addr, value, sizeof val->addr);

        /* store zone, if any */
        if (value_len > 4) {
            ret = lydict_insert(ctx, value_str + 4, value_len - 4, &val->zone);
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            val->zone = NULL;
        }

        /* success */
        goto cleanup;
    }

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    if (!(options & LYPLG_TYPE_STORE_ONLY)) {
        /* length restriction of the string */
        if (type_str->length) {
            /* value_len is in bytes, but we need number of characters here */
            ret = lyplg_type_validate_range(LY_TYPE_STRING, type_str->length, ly_utf8len(value, value_len), value, value_len, err);
            LY_CHECK_GOTO(ret, cleanup);
        }

        /* pattern restrictions */
        ret = lyplg_type_validate_patterns(type_str->patterns, value, value_len, err);
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* get the network-byte order address */
    ret = ipv4address_str2ip(value, value_len, options, ctx, &val->addr, &val->zone, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* store canonical value */
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
        options &= ~LYPLG_TYPE_STORE_DYNAMIC;
        LY_CHECK_GOTO(ret, cleanup);
    } else {
        ret = lydict_insert(ctx, value_len ? value : "", value_len, &storage->_canonical);
        LY_CHECK_GOTO(ret, cleanup);
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_ipv4_address(ctx, storage);
    }
    return ret;
}